

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_add.cxx
# Opt level: O1

int __thiscall
Fl_Menu_Item::insert
          (Fl_Menu_Item *this,int index,char *mytext,int sc,Fl_Callback *cb,void *data,int myflags)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  int size;
  Fl_Menu_Item *pFVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  bool bVar12;
  char buf [1024];
  char local_438 [1032];
  
  uVar8 = (ulong)(uint)index;
  size = local_array_size;
  if (local_array != this) {
    size = Fl_Menu_Item::size(this);
  }
  pFVar4 = this;
LAB_001c0e15:
  iVar11 = (int)uVar8;
  pcVar5 = local_438;
  if (*mytext == '_') {
    mytext = mytext + 1;
    uVar9 = 0x80;
  }
  else {
    pcVar6 = mytext;
    uVar10 = 0;
    uVar9 = 0;
    if (*mytext == '/') goto LAB_001c0f5e;
  }
  do {
    uVar10 = uVar9;
    cVar1 = *mytext;
    if (cVar1 == '\\') {
      if (mytext[1] != '\0') {
        mytext = mytext + 1;
      }
    }
    else if ((cVar1 == '\0') || (cVar1 == '/')) break;
    cVar1 = *mytext;
    mytext = mytext + 1;
    *pcVar5 = cVar1;
    pcVar5 = pcVar5 + 1;
    uVar9 = uVar10;
  } while( true );
  *pcVar5 = '\0';
  pcVar6 = local_438;
  if (*mytext != '/') goto LAB_001c0f5e;
  pcVar5 = pFVar4->text;
  while (bVar12 = pcVar5 != (char *)0x0, bVar12) {
    pcVar6 = local_438;
    if ((pFVar4->flags & 0x40) != 0) {
      do {
        cVar1 = *pcVar6;
        uVar9 = (int)cVar1 - (int)*pcVar5;
        if (uVar9 == 0) {
          if (cVar1 != '\0') {
            pcVar6 = pcVar6 + 1;
LAB_001c0eb7:
            pcVar5 = pcVar5 + 1;
            goto LAB_001c0eba;
          }
          uVar8 = 0;
          bVar2 = false;
        }
        else if (cVar1 == '&') {
          pcVar6 = pcVar6 + 1;
LAB_001c0eba:
          bVar2 = true;
        }
        else {
          if (*pcVar5 == '&') goto LAB_001c0eb7;
          bVar2 = false;
          uVar8 = (ulong)uVar9;
        }
      } while (bVar2);
      if ((int)uVar8 == 0) {
        if (bVar12) goto LAB_001c0f42;
        break;
      }
    }
    uVar8 = 1;
    pFVar4 = next(pFVar4,1);
    pcVar5 = pFVar4->text;
  }
  iVar11 = (int)((long)pFVar4 - (long)this >> 3) * -0x49249249;
  pFVar4 = array_insert(this,size,iVar11,local_438,uVar10 | 0x40);
  this = array_insert(pFVar4,size + 1,iVar11 + 1,(char *)0x0,0);
  size = size + 2;
  pFVar4 = this + iVar11;
LAB_001c0f42:
  mytext = mytext + 1;
  pFVar4 = pFVar4 + 1;
  uVar8 = 0xffffffff;
  goto LAB_001c0e15;
LAB_001c0f5e:
  pcVar5 = pFVar4->text;
  do {
    bVar12 = pcVar5 != (char *)0x0;
    if (!bVar12) {
LAB_001c0fec:
      if (iVar11 == -1) {
        iVar11 = (int)((ulong)((long)pFVar4 - (long)this) >> 3) * -0x49249249;
      }
      this = array_insert(this,size,iVar11,pcVar6,uVar10 | myflags);
      iVar3 = size + 1;
      if ((myflags & 0x40U) != 0) {
        this = array_insert(this,size + 1,iVar11 + 1,(char *)0x0,0);
        iVar3 = size + 2;
      }
      size = iVar3;
      pFVar4 = this + iVar11;
LAB_001c105f:
      pFVar4->shortcut_ = sc;
      pFVar4->callback_ = cb;
      pFVar4->user_data_ = data;
      pFVar4->flags = uVar10 | myflags;
      if (this == local_array) {
        local_array_size = size;
      }
      return (int)((ulong)((long)pFVar4 - (long)this) >> 3) * -0x49249249;
    }
    pcVar7 = pcVar6;
    if ((pFVar4->flags & 0x40) == 0) {
      do {
        cVar1 = *pcVar5;
        uVar9 = (int)cVar1 - (int)*pcVar7;
        if (uVar9 == 0) {
          if (cVar1 != '\0') {
            pcVar5 = pcVar5 + 1;
LAB_001c0fa9:
            pcVar7 = pcVar7 + 1;
            goto LAB_001c0fac;
          }
          uVar8 = 0;
          bVar2 = false;
        }
        else if (cVar1 == '&') {
          pcVar5 = pcVar5 + 1;
LAB_001c0fac:
          bVar2 = true;
        }
        else {
          if (*pcVar7 == '&') goto LAB_001c0fa9;
          bVar2 = false;
          uVar8 = (ulong)uVar9;
        }
      } while (bVar2);
      if ((int)uVar8 == 0) {
        if (bVar12) goto LAB_001c105f;
        goto LAB_001c0fec;
      }
    }
    uVar8 = 1;
    pFVar4 = next(pFVar4,1);
    pcVar5 = pFVar4->text;
  } while( true );
}

Assistant:

int Fl_Menu_Item::insert(
  int index,
  const char *mytext,
  int sc,
  Fl_Callback *cb,	
  void *data,
  int myflags
) {
  Fl_Menu_Item *array = this;
  Fl_Menu_Item *m = this;
  const char *p;
  char *q;
  char buf[1024];

  int msize = array==local_array ? local_array_size : array->size();
  int flags1 = 0;
  const char* item;

  // split at slashes to make submenus:
  for (;;) {

    // leading slash makes us assume it is a filename:
    if (*mytext == '/') {item = mytext; break;}

    // leading underscore causes divider line:
    if (*mytext == '_') {mytext++; flags1 = FL_MENU_DIVIDER;}

    // copy to buf, changing \x to x:
    q = buf;
    for (p=mytext; *p && *p != '/'; *q++ = *p++) if (*p=='\\' && p[1]) p++;
    *q = 0;

    item = buf;
    if (*p != '/') break; /* not a menu title */
    index = -1;           /* any submenu specified overrides insert position */
    mytext = p+1;         /* point at item title */

    /* find a matching menu title: */
    for (; m->text; m = m->next())
      if (m->flags&FL_SUBMENU && !compare(item, m->text)) break;

    if (!m->text) { /* create a new menu */
      int n = (index==-1) ? (int) (m-array) : index;
      array = array_insert(array, msize, n, item, FL_SUBMENU|flags1);
      msize++;
      array = array_insert(array, msize, n+1, 0, 0);
      msize++;
      m = array+n;
    }
    m++;	/* go into the submenu */
    flags1 = 0;
  }

  /* find a matching menu item: */
  for (; m->text; m = m->next())
    if (!(m->flags&FL_SUBMENU) && !compare(m->text,item)) break;

  if (!m->text) {	/* add a new menu item */
    int n = (index==-1) ? (int) (m-array) : index;
    array = array_insert(array, msize, n, item, myflags|flags1);
    msize++;
    if (myflags & FL_SUBMENU) { // add submenu delimiter
      array = array_insert(array, msize, n+1, 0, 0);
      msize++;
    }
    m = array+n;
  }

  /* fill it in */
  m->shortcut_ = sc;
  m->callback_ = cb;
  m->user_data_ = data;
  m->flags = myflags|flags1;

  if (array == local_array) local_array_size = msize;
  return (int) (m-array);
}